

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O0

ptr<Value> __thiscall Function::call(Function *this,ValueList *arguments)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  ThrowPacket *pTVar1;
  size_type sVar2;
  element_type *peVar3;
  size_type sVar4;
  Environment *other;
  reference ident;
  reference pvVar5;
  element_type *peVar6;
  vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar7;
  ptr<Value> value;
  int local_dc;
  undefined1 local_d8 [4];
  int i;
  Environment localEnv;
  string local_98;
  ptr<Value> local_78;
  undefined1 local_65;
  allocator<char> local_51;
  string local_50;
  ptr<Value> local_30;
  vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_> *local_20;
  ValueList *arguments_local;
  Function *this_local;
  
  arguments_local = arguments;
  this_local = this;
  if (arguments[2].
      super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    local_65 = 1;
    pTVar1 = (ThrowPacket *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Function owner not set",&local_51);
    ExceptionObjects::null_value((ExceptionObjects *)&local_30,&local_50);
    ThrowPacket::ThrowPacket(pTVar1,&local_30);
    local_65 = 0;
    __cxa_throw(pTVar1,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
  }
  local_20 = in_RDX;
  sVar2 = std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::size
                    (in_RDX);
  peVar3 = std::
           __shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(arguments->
                            super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(peVar3);
  if (sVar2 != sVar4) {
    localEnv.symbols._M_h._M_single_bucket._6_1_ = 1;
    pTVar1 = (ThrowPacket *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Invalid number of arguments",
               (allocator<char> *)((long)&localEnv.symbols._M_h._M_single_bucket + 7));
    ExceptionObjects::call_failed((ExceptionObjects *)&local_78,&local_98);
    ThrowPacket::ThrowPacket(pTVar1,&local_78);
    localEnv.symbols._M_h._M_single_bucket._6_1_ = 0;
    __cxa_throw(pTVar1,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
  }
  other = Object::getEnvironment
                    ((Object *)
                     arguments[2].
                     super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Environment::Environment((Environment *)local_d8,other);
  local_dc = 0;
  while( true ) {
    sVar2 = std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::size
                      (local_20);
    if (sVar2 <= (ulong)(long)local_dc) break;
    peVar3 = std::
             __shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(arguments->
                             super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>
                             )._M_impl.super__Vector_impl_data._M_end_of_storage);
    ident = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](peVar3,(long)local_dc);
    pvVar5 = std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::
             operator[](local_20,(long)local_dc);
    this_00 = &value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<Value>::shared_ptr((shared_ptr<Value> *)this_00,pvVar5);
    Environment::putValue((Environment *)local_d8,ident,Public,(ptr<Value> *)this_00,false);
    std::shared_ptr<Value>::~shared_ptr
              ((shared_ptr<Value> *)
               &value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    local_dc = local_dc + 1;
  }
  peVar6 = std::__shared_ptr_access<StatementBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<StatementBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&arguments[1].
                          super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  (**(peVar6->super_Statement)._vptr_Statement)(peVar6,local_d8);
  std::shared_ptr<Value>::shared_ptr((shared_ptr<Value> *)this,(nullptr_t)0x0);
  Environment::~Environment((Environment *)local_d8);
  pVar7.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar7.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Value;
  return (ptr<Value>)pVar7.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> call(ValueList& arguments) override {
        if(!owner)
            throw ThrowPacket(ExceptionObjects::null_value("Function owner not set"));

        if(arguments.size() != parameters -> size())
            throw ThrowPacket(ExceptionObjects::call_failed("Invalid number of arguments"));

        Environment localEnv = *(owner -> getEnvironment());

        for(int i = 0; i < arguments.size(); i++)
            localEnv.putValue((*parameters)[i], Scope::Public, arguments[i], false);

        try {
            statementBlock -> execute(&localEnv);
        } catch(ptr<Value> value) {
            return value;
        }

        return nullptr;
    }